

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
MessageVisitor<should_try_get_fields_after_parsing::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)52>,Fixpp::TagT<123u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<36u,Fixpp::Type::Int>>>,Fixpp::TypedParsingContext<void>>
          (undefined8 param_1,undefined8 *valueToken,long message,undefined8 param_4,undefined4 tag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  
  lVar1 = valueToken[1];
  lVar2 = *(long *)(*(long *)*valueToken + 8);
  lVar3 = *(long *)(*(long *)*valueToken + 0x10);
  uVar4 = valueToken[3];
  if (*(ulong *)(message + 0x40) <= *(ulong *)(message + 0x38)) {
    llvm::
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<123U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<36U,_Fixpp::Type::Int>_>_>::Unparsed,_false>
    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<123U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<36U,_Fixpp::Type::Int>_>_>::Unparsed,_false>
            *)(message + 0x30),0);
  }
  puVar5 = *(undefined4 **)(message + 0x38);
  *puVar5 = tag;
  *(undefined8 *)(puVar5 + 2) = uVar4;
  *(long *)(puVar5 + 4) = lVar3 - (lVar1 + lVar2);
  *(long *)(message + 0x38) = *(long *)(message + 0x38) + 0x18;
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }